

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.h
# Opt level: O0

vector<FBX::Node,_std::allocator<FBX::Node>_> *
FBX::findNodes(vector<FBX::Node,_std::allocator<FBX::Node>_> *__return_storage_ptr__,Node *node,
              string *nodeId)

{
  bool bVar1;
  __type _Var2;
  reference __x;
  Node *e;
  const_iterator __end1;
  const_iterator __begin1;
  vector<FBX::Node,_std::allocator<FBX::Node>_> *__range1;
  string *nodeId_local;
  Node *node_local;
  vector<FBX::Node,_std::allocator<FBX::Node>_> *nodes;
  
  std::vector<FBX::Node,_std::allocator<FBX::Node>_>::vector(__return_storage_ptr__);
  __end1 = std::vector<FBX::Node,_std::allocator<FBX::Node>_>::begin(&node->children);
  e = (Node *)std::vector<FBX::Node,_std::allocator<FBX::Node>_>::end(&node->children);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_FBX::Node_*,_std::vector<FBX::Node,_std::allocator<FBX::Node>_>_>
                                     *)&e), bVar1) {
    __x = __gnu_cxx::
          __normal_iterator<const_FBX::Node_*,_std::vector<FBX::Node,_std::allocator<FBX::Node>_>_>
          ::operator*(&__end1);
    _Var2 = std::operator==(&__x->id,nodeId);
    if (_Var2) {
      std::vector<FBX::Node,_std::allocator<FBX::Node>_>::push_back(__return_storage_ptr__,__x);
    }
    __gnu_cxx::
    __normal_iterator<const_FBX::Node_*,_std::vector<FBX::Node,_std::allocator<FBX::Node>_>_>::
    operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<Node> findNodes(const Node &node, const std::string &nodeId) {
        std::vector<Node> nodes;

        for (const Node &e : node.children)
            if (e.id == nodeId)
                nodes.push_back(e);
        return nodes;
    }